

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

void lyb_insert_node(lyd_lyb_ctx *lybctx,lyd_node *parent,lyd_node *node,lyd_node **first_p,
                    ly_set *parsed)

{
  lyd_node *plVar1;
  lys_module *plVar2;
  lys_module *plVar3;
  
  if (parent == (lyd_node *)0x0) {
    lyd_insert_node((lyd_node *)0x0,first_p,node,(lybctx->field_1).field_0.parse_opts >> 0x15 & 1);
  }
  else {
    if (parent->schema == (lysc_node *)0x0) {
      plVar2 = (lys_module *)&parent[2].schema;
    }
    else {
      plVar2 = parent->schema->module;
    }
    if (node->schema == (lysc_node *)0x0) {
      plVar3 = (lys_module *)&node[2].schema;
    }
    else {
      plVar3 = node->schema->module;
    }
    if (plVar2->ctx != plVar3->ctx) {
      lyplg_ext_insert(parent,node);
      goto LAB_0013827e;
    }
    lyd_insert_node(parent,first_p,node,(lybctx->field_1).field_0.parse_opts >> 0x15 & 1);
    if (parent != (lyd_node *)0x0) goto LAB_0013827e;
  }
  plVar1 = *first_p;
  while (plVar1 = plVar1->prev, plVar1->next != (lyd_node *)0x0) {
    *first_p = plVar1;
  }
LAB_0013827e:
  if (parsed != (ly_set *)0x0) {
    ly_set_add(parsed,node,'\x01',(uint32_t *)0x0);
    return;
  }
  return;
}

Assistant:

static void
lyb_insert_node(struct lyd_lyb_ctx *lybctx, struct lyd_node *parent, struct lyd_node *node, struct lyd_node **first_p,
        struct ly_set *parsed)
{
    /* insert, keep first pointer correct */
    if (parent && (LYD_CTX(parent) != LYD_CTX(node))) {
        lyplg_ext_insert(parent, node);
    } else {
        lyd_insert_node(parent, first_p, node,
                lybctx->parse_opts & LYD_PARSE_ORDERED ? LYD_INSERT_NODE_LAST : LYD_INSERT_NODE_DEFAULT);
    }
    while (!parent && (*first_p)->prev->next) {
        *first_p = (*first_p)->prev;
    }

    /* rememeber a successfully parsed node */
    if (parsed) {
        ly_set_add(parsed, node, 1, NULL);
    }
}